

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::DoReserveMembers
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType newCapacity,
          CrtAllocator *allocator)

{
  void *pvVar1;
  ObjectData *o;
  
  if ((this->data_).s.hashcode < newCapacity) {
    pvVar1 = realloc((void *)((ulong)(this->data_).s.str & 0xffffffffffff),(ulong)newCapacity << 5);
    (this->data_).s.str = (Ch *)((ulong)(this->data_).f.flags << 0x30 | (ulong)pvVar1);
    (this->data_).s.hashcode = newCapacity;
  }
  return;
}

Assistant:

void DoReserveMembers(SizeType newCapacity, Allocator& allocator) {
        ObjectData& o = data_.o;
        if (newCapacity > o.capacity) {
            Member* newMembers = Realloc<Member>(allocator, GetMembersPointer(), o.capacity, newCapacity);
            RAPIDJSON_SETPOINTER(Member, o.members, newMembers);
            o.capacity = newCapacity;
        }
    }